

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::StreamingListener::UrlEncode_abi_cxx11_
          (string *__return_storage_ptr__,StreamingListener *this,char *str)

{
  uchar value;
  String *this_00;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  strlen((char *)this);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  do {
    this_00 = (String *)
              (ulong)*(byte *)&(this->super_EmptyTestEventListener).super_TestEventListener.
                               _vptr_TestEventListener;
    if (this_00 < (String *)0x3e) {
      if ((0x2000006000000400U >> ((ulong)this_00 & 0x3f) & 1) == 0) {
        if (this_00 == (String *)0x0) {
          return __return_storage_ptr__;
        }
        goto LAB_0014aa24;
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      String::FormatByte_abi_cxx11_(&local_50,this_00,value);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
LAB_0014aa24:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    this = (StreamingListener *)
           ((long)&(this->super_EmptyTestEventListener).super_TestEventListener.
                   _vptr_TestEventListener + 1);
  } while( true );
}

Assistant:

std::string StreamingListener::UrlEncode(const char* str) {
  std::string result;
  result.reserve(strlen(str) + 1);
  for (char ch = *str; ch != '\0'; ch = *++str) {
    switch (ch) {
      case '%':
      case '=':
      case '&':
      case '\n':
        result.push_back('%');
        result.append(String::FormatByte(static_cast<unsigned char>(ch)));
        break;
      default:
        result.push_back(ch);
        break;
    }
  }
  return result;
}